

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_getOwnPropertyDescriptor
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValueUnion JVar1;
  JSValue val;
  JSValue val_00;
  JSAtom prop;
  int iVar2;
  JSAtom prop_00;
  ulong uVar3;
  ulong uVar4;
  JSRefCountHeader *p;
  JSValue v;
  JSValue JVar5;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSPropertyDescriptor desc;
  
  if (magic == 0) {
    v = JS_ToObject(ctx,*argv);
    if ((int)v.tag == 6) {
      return v;
    }
  }
  else {
    if ((int)argv->tag != -1) {
      JS_ThrowTypeErrorNotAnObject(ctx);
      goto LAB_00152046;
    }
    JVar1 = (JSValueUnion)(argv->u).ptr;
    v.tag = argv->tag;
    v.u.ptr = JVar1.ptr;
    *(int *)JVar1.ptr = *JVar1.ptr + 1;
  }
  prop = JS_ValueToAtom(ctx,argv[1]);
  if (prop != 0) {
    JVar5.tag = 3;
    if ((int)v.tag != -1) {
LAB_0015204f:
      uVar4 = 0;
      uVar3 = 0;
LAB_0015205c:
      JVar5.tag = JVar5.tag;
      JVar5.u.ptr = (void *)(uVar4 | uVar3);
      JS_FreeAtom(ctx,prop);
      JS_FreeValue(ctx,v);
      return JVar5;
    }
    iVar2 = JS_GetOwnPropertyInternal(ctx,&desc,(JSObject *)v.u.ptr,prop);
    if (-1 < iVar2) {
      if (iVar2 == 0) goto LAB_0015204f;
      JVar5 = JS_NewObject(ctx);
      JVar5.tag = JVar5.tag;
      if ((int)JVar5.tag != 6) {
        if ((desc.flags & 0x10U) == 0) {
          val.tag = desc.value.tag;
          val.u.float64 = desc.value.u.float64;
          if (0xfffffff4 < (uint)desc.value.tag) {
            *(int *)desc.value.u.ptr = *desc.value.u.ptr + 1;
          }
          iVar2 = JS_DefinePropertyValue(ctx,JVar5,0x40,val,0x4007);
          if (-1 < iVar2) {
            desc.setter.u._0_4_ = (uint)desc.flags >> 1 & 1;
            desc.setter.u._4_4_ = 0;
            prop_00 = 0x3e;
            desc.setter.tag = 1;
LAB_00152135:
            val_01.tag = desc.setter.tag;
            val_01.u.float64 = desc.setter.u.float64;
            iVar2 = JS_DefinePropertyValue(ctx,JVar5,prop_00,val_01,0x4007);
            if (((-1 < iVar2) &&
                (val_02.u._0_4_ = (uint)desc.flags >> 2 & 1, val_02.u._4_4_ = 0, val_02.tag = 1,
                iVar2 = JS_DefinePropertyValue(ctx,JVar5,0x3f,val_02,0x4007), -1 < iVar2)) &&
               (val_03.u._0_4_ = desc.flags & 1, val_03.u._4_4_ = 0, val_03.tag = 1,
               iVar2 = JS_DefinePropertyValue(ctx,JVar5,0x3d,val_03,0x4007), -1 < iVar2)) {
              uVar3 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
              js_free_desc(ctx,&desc);
              uVar4 = (ulong)JVar5.u.ptr & 0xffffffff;
              goto LAB_0015205c;
            }
          }
        }
        else {
          val_00.tag = desc.getter.tag;
          val_00.u.float64 = desc.getter.u.float64;
          if (0xfffffff4 < (uint)desc.getter.tag) {
            *(int *)desc.getter.u.ptr = *desc.getter.u.ptr + 1;
          }
          iVar2 = JS_DefinePropertyValue(ctx,JVar5,0x41,val_00,0x4007);
          if (-1 < iVar2) {
            if (0xfffffff4 < (uint)desc.setter.tag) {
              *(int *)desc.setter.u.ptr = *desc.setter.u.ptr + 1;
            }
            prop_00 = 0x42;
            goto LAB_00152135;
          }
        }
      }
      js_free_desc(ctx,&desc);
      JS_FreeValue(ctx,JVar5);
    }
  }
  JS_FreeAtom(ctx,prop);
  JS_FreeValue(ctx,v);
LAB_00152046:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_object_getOwnPropertyDescriptor(JSContext *ctx, JSValueConst this_val,
                                                  int argc, JSValueConst *argv, int magic)
{
    JSValueConst prop;
    JSAtom atom;
    JSValue ret, obj;
    JSPropertyDescriptor desc;
    int res, flags;

    if (magic) {
        /* Reflect.getOwnPropertyDescriptor case */
        if (JS_VALUE_GET_TAG(argv[0]) != JS_TAG_OBJECT)
            return JS_ThrowTypeErrorNotAnObject(ctx);
        obj = JS_DupValue(ctx, argv[0]);
    } else {
        obj = JS_ToObject(ctx, argv[0]);
        if (JS_IsException(obj))
            return obj;
    }
    prop = argv[1];
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        goto exception;
    ret = JS_UNDEFINED;
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        res = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(obj), atom);
        if (res < 0)
            goto exception;
        if (res) {
            ret = JS_NewObject(ctx);
            if (JS_IsException(ret))
                goto exception1;
            flags = JS_PROP_C_W_E | JS_PROP_THROW;
            if (desc.flags & JS_PROP_GETSET) {
                if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_get, JS_DupValue(ctx, desc.getter), flags) < 0
                ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_set, JS_DupValue(ctx, desc.setter), flags) < 0)
                    goto exception1;
            } else {
                if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_value, JS_DupValue(ctx, desc.value), flags) < 0
                ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_writable,
                                           JS_NewBool(ctx, (desc.flags & JS_PROP_WRITABLE) != 0), flags) < 0)
                    goto exception1;
            }
            if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_enumerable,
                                       JS_NewBool(ctx, (desc.flags & JS_PROP_ENUMERABLE) != 0), flags) < 0
            ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_configurable,
                                       JS_NewBool(ctx, (desc.flags & JS_PROP_CONFIGURABLE) != 0), flags) < 0)
                goto exception1;
            js_free_desc(ctx, &desc);
        }
    }
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    return ret;

exception1:
    js_free_desc(ctx, &desc);
    JS_FreeValue(ctx, ret);
exception:
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}